

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3SnippetFunc(sqlite3_context *pContext,int nVal,sqlite3_value **apVal)

{
  int iVar1;
  int local_48;
  int local_44;
  int nToken;
  int iCol;
  char *zEllipsis;
  char *zEnd;
  char *zStart;
  Fts3Cursor *pCsr;
  sqlite3_value **apVal_local;
  sqlite3_context *psStack_10;
  int nVal_local;
  sqlite3_context *pContext_local;
  
  zEnd = "<b>";
  zEllipsis = "</b>";
  _nToken = "<b>...</b>";
  local_44 = -1;
  local_48 = 0xf;
  pCsr = (Fts3Cursor *)apVal;
  apVal_local._4_4_ = nVal;
  psStack_10 = pContext;
  if (nVal < 7) {
    iVar1 = fts3FunctionArg(pContext,"snippet",*apVal,(Fts3Cursor **)&zStart);
    if (iVar1 == 0) {
      if (apVal_local._4_4_ - 2U < 4 || apVal_local._4_4_ == 6) {
        switch((long)&switchD_0020ac1a::switchdataD_00226c78 +
               (long)(int)(&switchD_0020ac1a::switchdataD_00226c78)[apVal_local._4_4_ - 2U]) {
        case 0x20ac1c:
          local_48 = sqlite3_value_int((sqlite3_value *)pCsr->pDeferred);
        case 0x20ac2c:
          local_44 = sqlite3_value_int(*(sqlite3_value **)&pCsr->iLangid);
        case 0x20ac3c:
          _nToken = (char *)sqlite3_value_text((sqlite3_value *)pCsr->pExpr);
        case 0x20ac4d:
          zEllipsis = (char *)sqlite3_value_text((sqlite3_value *)pCsr->pStmt);
        case 0x20ac5e:
          zEnd = (char *)sqlite3_value_text(*(sqlite3_value **)&pCsr->eSearch);
        }
      }
      if ((((uchar *)_nToken == (uchar *)0x0) || (zEllipsis == (char *)0x0)) ||
         (zEnd == (char *)0x0)) {
        sqlite3_result_error_nomem(psStack_10);
      }
      else if (local_48 == 0) {
        sqlite3_result_text(psStack_10,"",-1,(_func_void_void_ptr *)0x0);
      }
      else {
        iVar1 = fts3CursorSeek(psStack_10,(Fts3Cursor *)zStart);
        if (iVar1 == 0) {
          sqlite3Fts3Snippet(psStack_10,(Fts3Cursor *)zStart,zEnd,zEllipsis,_nToken,local_44,
                             local_48);
        }
      }
    }
  }
  else {
    sqlite3_result_error(pContext,"wrong number of arguments to function snippet()",-1);
  }
  return;
}

Assistant:

static void fts3SnippetFunc(
  sqlite3_context *pContext,      /* SQLite function call context */
  int nVal,                       /* Size of apVal[] array */
  sqlite3_value **apVal           /* Array of arguments */
){
  Fts3Cursor *pCsr;               /* Cursor handle passed through apVal[0] */
  const char *zStart = "<b>";
  const char *zEnd = "</b>";
  const char *zEllipsis = "<b>...</b>";
  int iCol = -1;
  int nToken = 15;                /* Default number of tokens in snippet */

  /* There must be at least one argument passed to this function (otherwise
  ** the non-overloaded version would have been called instead of this one).
  */
  assert( nVal>=1 );

  if( nVal>6 ){
    sqlite3_result_error(pContext, 
        "wrong number of arguments to function snippet()", -1);
    return;
  }
  if( fts3FunctionArg(pContext, "snippet", apVal[0], &pCsr) ) return;

  switch( nVal ){
    case 6: nToken = sqlite3_value_int(apVal[5]);
    case 5: iCol = sqlite3_value_int(apVal[4]);
    case 4: zEllipsis = (const char*)sqlite3_value_text(apVal[3]);
    case 3: zEnd = (const char*)sqlite3_value_text(apVal[2]);
    case 2: zStart = (const char*)sqlite3_value_text(apVal[1]);
  }
  if( !zEllipsis || !zEnd || !zStart ){
    sqlite3_result_error_nomem(pContext);
  }else if( nToken==0 ){
    sqlite3_result_text(pContext, "", -1, SQLITE_STATIC);
  }else if( SQLITE_OK==fts3CursorSeek(pContext, pCsr) ){
    sqlite3Fts3Snippet(pContext, pCsr, zStart, zEnd, zEllipsis, iCol, nToken);
  }
}